

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

int longestLine(string *input)

{
  wchar_t ucs;
  int iVar1;
  int iVar2;
  int iVar3;
  size_type i;
  size_type local_28;
  
  local_28 = 0;
  iVar2 = 0;
  do {
    iVar3 = 0;
    while( true ) {
      ucs = utf8_next_char(input,&local_28);
      if (ucs == L'\0') {
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        return iVar2;
      }
      if (ucs == L'\n') break;
      iVar1 = mk_wcwidth(ucs);
      iVar3 = iVar3 + iVar1;
    }
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
  } while( true );
}

Assistant:

int longestLine (const std::string& input)
{
  int longest = 0;
  int length = 0;
  std::string::size_type i = 0;
  int character;

  while ((character = utf8_next_char (input, i)))
  {
    if (character == '\n')
    {
      if (length > longest)
        longest = length;

      length = 0;
    }
    else
      length += mk_wcwidth (character);
  }

  if (length > longest)
    longest = length;

  return longest;
}